

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O2

void __thiscall
vk::SimpleAllocation::SimpleAllocation
          (SimpleAllocation *this,Move<vk::Handle<(vk::HandleType)7>_> *mem,
          MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
          *hostPtr)

{
  HostPtr *pHVar1;
  deUint64 dVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  void *pvVar6;
  
  pHVar1 = (hostPtr->
           super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
           ).m_data.ptr;
  if (pHVar1 == (HostPtr *)0x0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = pHVar1->m_ptr;
  }
  (this->super_Allocation).m_memory.m_internal =
       (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal;
  (this->super_Allocation).m_offset = 0;
  (this->super_Allocation).m_hostPtr = pvVar6;
  (this->super_Allocation)._vptr_Allocation = (_func_int **)&PTR__SimpleAllocation_00c234d8;
  dVar2 = (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal;
  pDVar3 = (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_deviceIface;
  pVVar4 = (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_device;
  pVVar5 = (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_allocator;
  (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal = 0;
  (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_device = (VkDevice)0x0;
  (mem->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_memHolder).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = pVVar4
  ;
  (this->m_memHolder).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       pVVar5;
  (this->m_memHolder).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = dVar2
  ;
  (this->m_memHolder).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       pDVar3;
  pHVar1 = (hostPtr->
           super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
           ).m_data.ptr;
  (hostPtr->
  super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ).m_data.ptr = (HostPtr *)0x0;
  (this->m_hostPtr).
  super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  .m_data.ptr = pHVar1;
  return;
}

Assistant:

SimpleAllocation::SimpleAllocation (Move<VkDeviceMemory> mem, MovePtr<HostPtr> hostPtr)
	: Allocation	(*mem, (VkDeviceSize)0, hostPtr ? hostPtr->get() : DE_NULL)
	, m_memHolder	(mem)
	, m_hostPtr		(hostPtr)
{
}